

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_string.cc
# Opt level: O0

string * Rtrim(string *s)

{
  unary_negate<std::pointer_to_unary_function<int,_int>_> __last;
  string *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  undefined8 local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  unary_negate<std::pointer_to_unary_function<int,_int>_> in_stack_ffffffffffffffd8;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  char *local_18;
  undefined8 local_10;
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::ptr_fun<int,int>((_func_int_int *)in_stack_ffffffffffffff98);
  __last = std::not1<std::pointer_to_unary_function<int,int>>
                     ((pointer_to_unary_function<int,_int> *)in_stack_ffffffffffffff98);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            (in_stack_ffffffffffffffd0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__last._M_pred._M_ptr,in_stack_ffffffffffffffd8);
  local_18 = (char *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::base(&local_20);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::erase(in_RDI,local_10,local_48);
  return local_8;
}

Assistant:

std::string &Rtrim(std::string &s) {
    s.erase(std::find_if(s.rbegin(), s.rend(),
            std::not1(std::ptr_fun<int, int>(std::isspace))).base(), s.end());
    return s;
}